

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::AddNodePrefixes(aiNode *node,char *prefix,uint len)

{
  char *__src;
  ai_uint32 aVar1;
  Logger *this;
  ulong uVar2;
  
  aVar1 = (node->mName).length;
  if ((aVar1 == 0) || ((node->mName).data[0] != '$')) {
    if (aVar1 + len < 0x3ff) {
      __src = (node->mName).data;
      memmove(__src + len,__src,(ulong)(aVar1 + 1));
      memcpy(__src,prefix,(ulong)len);
      (node->mName).length = (node->mName).length + len;
    }
    else {
      this = DefaultLogger::get();
      Logger::debug(this,"Can\'t add an unique prefix because the string is too long");
    }
  }
  if (node->mNumChildren != 0) {
    uVar2 = 0;
    do {
      AddNodePrefixes(node->mChildren[uVar2],prefix,len);
      uVar2 = uVar2 + 1;
    } while (uVar2 < node->mNumChildren);
  }
  return;
}

Assistant:

void SceneCombiner::AddNodePrefixes(aiNode* node, const char* prefix, unsigned int len) {
    ai_assert(NULL != prefix);
    PrefixString(node->mName,prefix,len);

    // Process all children recursively
    for ( unsigned int i = 0; i < node->mNumChildren; ++i ) {
        AddNodePrefixes( node->mChildren[ i ], prefix, len );
    }
}